

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ExclusiveJoinPromiseNode> __thiscall
kj::heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params,Own<kj::_::PromiseNode> *params_1)

{
  ExclusiveJoinPromiseNode *this_00;
  Own<kj::_::PromiseNode> *pOVar1;
  ExclusiveJoinPromiseNode *extraout_RDX;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar2;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> *local_20;
  Own<kj::_::PromiseNode> *params_local_1;
  Own<kj::_::PromiseNode> *params_local;
  
  local_20 = params_1;
  params_local_1 = params;
  params_local = (Own<kj::_::PromiseNode> *)this;
  this_00 = (ExclusiveJoinPromiseNode *)operator_new(0x90);
  pOVar1 = fwd<kj::Own<kj::_::PromiseNode>>(params_local_1);
  Own<kj::_::PromiseNode>::Own(&local_30,pOVar1);
  pOVar1 = fwd<kj::Own<kj::_::PromiseNode>>(local_20);
  Own<kj::_::PromiseNode>::Own(&local_40,pOVar1);
  _::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(this_00,&local_30,&local_40);
  Own<kj::_::ExclusiveJoinPromiseNode>::Own
            ((Own<kj::_::ExclusiveJoinPromiseNode> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ExclusiveJoinPromiseNode>::instance);
  Own<kj::_::PromiseNode>::~Own(&local_40);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}